

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O2

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* wasm::DFA::Internal::refinePartitionsImpl
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *__return_storage_ptr__,InputGraph *inputGraph)

{
  pointer *this;
  long *plVar1;
  pointer pvVar2;
  pointer puVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar6;
  long lVar7;
  pointer pvVar8;
  iterator iVar9;
  Partitions *pPVar10;
  Partitions *pPVar11;
  iterator iVar12;
  _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  *this_00;
  pointer pTVar13;
  pointer __dest;
  _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  *p_Var14;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var15;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *partition;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__k;
  unsigned_long uVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar17;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t __n;
  _Base_ptr p_Var18;
  InputGraph *__range2;
  ulong uVar19;
  long lVar20;
  long *plVar21;
  undefined1 auVar22 [8];
  Partitions *pPVar23;
  size_t sVar24;
  pointer pvVar25;
  const_iterator __end3;
  pointer pvVar26;
  pointer puVar27;
  unsigned_long uVar28;
  pointer pTVar29;
  _Base_ptr __y;
  size_t sVar30;
  void *__dest_00;
  pointer pTVar31;
  pointer puVar32;
  bool bVar33;
  undefined1 local_288 [8];
  Partitions partitions;
  Partitions splitters;
  size_t newSplitter;
  undefined1 local_118 [8];
  Set splitter;
  const_iterator __end2;
  undefined1 auStack_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> transitionIndices;
  undefined1 auStack_d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> potentialSplitters;
  undefined1 auStack_a8 [8];
  Set partition_2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *resultPartitions;
  vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  transitions;
  undefined1 auStack_68 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> markedPartitions;
  unsigned_long local_48;
  pointer local_40;
  
  pTVar29 = (pointer)0x0;
  puVar27 = (pointer)0x0;
  for (pvVar8 = (inputGraph->
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar8 != (inputGraph->
                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
    pvVar25 = (pvVar8->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (pvVar8->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)pvVar2 - (long)pvVar25;
    for (; pvVar25 != pvVar2; pvVar25 = pvVar25 + 1) {
      pTVar29 = (pointer)((long)&(((_Vector_impl *)&pTVar29->pred)->super__Vector_impl_data).
                                 _M_start +
                         ((long)(pvVar25->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar25->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    puVar27 = (pointer)((long)puVar27 + lVar7 / 0x18);
  }
  anon_unknown_0::Partitions::Partitions((Partitions *)local_288,(size_t)puVar27);
  splitter.index =
       (size_t)(inputGraph->
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = (inputGraph->
           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar28 = 0;
  for (pvVar26 = pvVar8; pvVar26 != (pointer)splitter.index; pvVar26 = pvVar26 + 1) {
    partitions.setIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[(long)local_288] = uVar28;
    partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[(long)local_288] = uVar28;
    lVar7 = ((long)(pvVar26->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar26->
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x18;
    uVar16 = lVar7 + uVar28;
    while (bVar33 = lVar7 != 0, lVar7 = lVar7 + -1, bVar33) {
      *(unsigned_long *)(partitions.sets + uVar28 * 8) = uVar28;
      partitions.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[uVar28] = uVar28;
      partitions.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[uVar28] = (unsigned_long)local_288;
      uVar28 = uVar28 + 1;
    }
    partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[(long)local_288] = uVar16;
    uVar28 = uVar16;
    local_288 = (undefined1  [8])((long)local_288 + 1);
  }
  resultPartitions =
       (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        *)0x0;
  transitions.
  super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  transitions.
  super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  transitionIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = &splitters.sets;
  splitters.sets._0_4_ = 0;
  __k = &splitters.elements;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  splitters.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_48 = 0;
  pPVar23 = (Partitions *)
            partitions.beginnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  do {
    pTVar13 = transitions.
              super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = resultPartitions;
    if (pvVar8 == (pointer)splitter.index) {
      if ((ulong)pTVar29 >> 0x3b == 0) {
        pTVar31 = (pointer)((long)transitions.
                                  super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)resultPartitions >> 4);
        if (pTVar31 < pTVar29) {
          __dest = std::
                   _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                   ::_M_allocate((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                                  *)pTVar29,(size_t)pPVar23);
          sVar30 = (long)pTVar13 - (long)pvVar6;
          sVar24 = extraout_RDX_02;
          if (0 < (long)sVar30) {
            memmove(__dest,pvVar6,sVar30);
            sVar24 = extraout_RDX_03;
          }
          std::
          _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
          ::_M_deallocate((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)pvVar6,pTVar31,sVar24);
          transitions.
          super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(sVar30 + (long)__dest);
          transitions.
          super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
          ._M_impl.super__Vector_impl_data._M_finish = __dest + (long)pTVar29;
          resultPartitions =
               (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)__dest;
        }
        local_40 = transitions.
                   super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pTVar29 = (pointer)resultPartitions;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8,
                   (long)puVar27 + 1);
        pTVar13 = transitions.
                  super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (puVar32 = (pointer)0x0; pvVar6 = resultPartitions, puVar27 != puVar32;
            puVar32 = (pointer)((long)puVar32 + 1)) {
          sVar30 = (long)pTVar13 - (long)pTVar29;
          auStack_68 = (undefined1  [8])((long)sVar30 >> 4);
          auStack_d8 = (undefined1  [8])puVar32;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8,
                     (unsigned_long *)auStack_68);
          iVar9 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                  ::_M_lower_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                                    *)splitters.elements.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                   (_Link_type)&splitters,(_Base_ptr)auStack_d8,(unsigned_long *)__k
                                  );
          if (((Partitions *)iVar9._M_node != &splitters) &&
             (*(pointer *)(iVar9._M_node + 1) <= puVar32)) {
            p_Var18 = iVar9._M_node[1]._M_parent;
            if (p_Var18 != iVar9._M_node[1]._M_left) {
              uVar19 = (long)iVar9._M_node[1]._M_left - (long)p_Var18;
              if ((ulong)((long)local_40 - (long)pTVar13) < uVar19) {
                sVar24 = (long)uVar19 >> 4;
                markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var18;
                p_Var14 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           *)std::
                             vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                             ::_M_check_len((vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                                             *)&resultPartitions,sVar24,"vector::_M_range_insert");
                pTVar31 = std::
                          _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                          ::_M_allocate(p_Var14,sVar24);
                if (pTVar29 != pTVar13) {
                  memmove(pTVar31,pTVar29,sVar30);
                }
                memcpy((void *)(sVar30 + (long)pTVar31),
                       markedPartitions.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,uVar19);
                pTVar13 = (pointer)((long)(sVar30 + (long)pTVar31) + uVar19);
                std::
                _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                ::_M_deallocate((_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                                 *)pTVar29,(pointer)((long)local_40 - (long)pTVar29 >> 4),__n);
                transitions.
                super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                ._M_impl.super__Vector_impl_data._M_finish = pTVar31 + (long)p_Var14;
                pTVar29 = pTVar31;
                resultPartitions =
                     (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)pTVar31;
                transitions.
                super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                ._M_impl.super__Vector_impl_data._M_start = pTVar13;
                local_40 = transitions.
                           super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                memmove(pTVar13,p_Var18,uVar19);
                pTVar13 = (pointer)((long)pTVar13 + uVar19);
                transitions.
                super__Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                ._M_impl.super__Vector_impl_data._M_start = pTVar13;
              }
            }
          }
        }
        puVar27 = (pointer)((long)pTVar13 - (long)resultPartitions >> 4);
        auStack_d8 = (undefined1  [8])puVar27;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8,
                   (unsigned_long *)auStack_d8);
        std::
        map<unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
        ::~map((map<unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                *)&partitions.pivots.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        this = &partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
        anon_unknown_0::Partitions::Partitions((Partitions *)this,(size_t)puVar27);
        uVar28 = 0;
        for (uVar19 = 0; uVar19 < (ulong)local_288; uVar19 = uVar19 + 1) {
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)potentialSplitters.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&potentialSplitters;
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               (pointer)(partitions.sets +
                        partitions.beginnings.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[uVar19] * 8);
          for (puVar27 = (pointer)(partitions.sets +
                                  partitions.setIndices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage[uVar19] * 8);
              puVar3 = splitters.endings.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
              puVar32 = splitters.setIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
              puVar27 !=
              markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage; puVar27 = puVar27 + 1) {
            puVar32 = *(pointer *)((long)auStack_f8 + (*puVar27 + 1) * 8);
            for (auStack_68 = *(undefined1 (*) [8])((long)auStack_f8 + *puVar27 * 8);
                (ulong)auStack_68 < puVar32; auStack_68 = (undefined1  [8])((long)auStack_68 + 1)) {
              this_01 = std::
                        map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        ::operator[]((map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                      *)auStack_d8,
                                     (key_type_conflict *)
                                     (&(pvVar6->
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish +
                                     (long)auStack_68 * 2));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        (this_01,(value_type_conflict3 *)auStack_68);
            }
          }
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               splitters.beginnings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          for (p_Var15 = (_Rb_tree_node_base *)
                         potentialSplitters.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              p_Var15 != (_Rb_tree_node_base *)&potentialSplitters;
              p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
            puVar32[(long)partitions.pivots.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage] = uVar28;
            puVar3[(long)partitions.pivots.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage] = uVar28;
            p_Var4 = p_Var15[1]._M_left;
            for (p_Var18 = p_Var15[1]._M_parent; p_Var18 != p_Var4;
                p_Var18 = (_Base_ptr)&p_Var18->_M_parent) {
              lVar7 = *(long *)p_Var18;
              *(long *)(CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets) + uVar28 * 8) =
                   lVar7;
              splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[lVar7] = uVar28;
              splitters.elementIndices.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[lVar7] =
                   (unsigned_long)
                   partitions.pivots.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              uVar28 = uVar28 + 1;
            }
            markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage
            [(long)partitions.pivots.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage] = uVar28;
            partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)partitions.pivots.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)auStack_d8);
        }
        auStack_d8 = (undefined1  [8])0x0;
        potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_d8,
                   (size_type)
                   partitions.pivots.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        for (auStack_68 = (undefined1  [8])0x0;
            (ulong)auStack_68 <
            partitions.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
            auStack_68 = (undefined1  [8])((long)auStack_68 + 1)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_d8,
                     (value_type_conflict3 *)auStack_68);
        }
        while (auStack_d8 !=
               (undefined1  [8])
               potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start) {
          puVar27 = potentialSplitters.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + -1;
          potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               potentialSplitters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + -1;
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_68 = (undefined1  [8])0x0;
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          lVar7 = CONCAT44(splitters.sets._4_4_,(undefined4)splitters.sets);
          uVar28 = splitters.beginnings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[*puVar27];
          for (lVar20 = splitters.setIndices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[*puVar27] << 3;
              puVar27 = markedPartitions.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start, auVar22 = auStack_68,
              uVar28 << 3 != lVar20; lVar20 = lVar20 + 8) {
            pvVar25 = (&(pvVar6->
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)[*(long *)(lVar7 + lVar20) * 2];
            partition_2.partitions =
                 (Partitions *)
                 partitions.elementIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[(long)pvVar25];
            auStack_a8 = (undefined1  [8])local_288;
            if (partitions.endings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[(long)partition_2.partitions] ==
                partitions.setIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[(long)partition_2.partitions]) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68,
                         (value_type_conflict3 *)&partition_2);
            }
            anon_unknown_0::Partitions::mark((Partitions *)local_288,(size_t)pvVar25);
          }
          for (; auVar22 != (undefined1  [8])puVar27; auVar22 = (undefined1  [8])((long)auVar22 + 8)
              ) {
            pPVar23 = *(Partitions **)auVar22;
            auStack_a8 = (undefined1  [8])local_288;
            partition_2.partitions = pPVar23;
            pPVar10 = (Partitions *)anon_unknown_0::Partitions::Set::split((Set *)auStack_a8);
            if (pPVar10 != (Partitions *)0x0) {
              if (partitions.beginnings.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[(long)pPVar10] -
                  partitions.setIndices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[(long)pPVar10] <
                  partitions.beginnings.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[(long)pPVar23] -
                  partitions.setIndices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage[(long)pPVar23]) {
                pPVar10 = pPVar23;
              }
              auStack_a8 = (undefined1  [8])0x0;
              partition_2.partitions = (Partitions *)0x0;
              partition_2.index = 0;
              plVar1 = (long *)(partitions.sets +
                               partitions.beginnings.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[(long)pPVar10] * 8)
              ;
              markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auVar22;
              for (plVar21 = (long *)(partitions.sets +
                                     partitions.setIndices.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     [(long)pPVar10] * 8); pPVar23 = partition_2.partitions,
                  auVar22 = auStack_a8, plVar21 != plVar1; plVar21 = plVar21 + 1) {
                uVar5 = *(ulong *)((long)auStack_f8 + (*plVar21 + 1) * 8);
                for (uVar19 = *(ulong *)((long)auStack_f8 + *plVar21 * 8); uVar19 < uVar5;
                    uVar19 = uVar19 + 1) {
                  splitter.partitions =
                       (Partitions *)
                       splitters.elementIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[uVar19];
                  local_118 = (undefined1  [8])this;
                  if (splitters.endings.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[(long)splitter.partitions] ==
                      splitters.setIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage[(long)splitter.partitions]) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_a8,
                               (value_type_conflict3 *)&splitter);
                  }
                  anon_unknown_0::Partitions::mark((Partitions *)this,uVar19);
                }
              }
              for (; auVar22 != (undefined1  [8])pPVar23;
                  auVar22 = (undefined1  [8])&((Partitions *)auVar22)->elements) {
                splitter.partitions = (Partitions *)((Partitions *)auVar22)->sets;
                local_118 = (undefined1  [8])this;
                splitters.pivots.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)anon_unknown_0::Partitions::Set::split((Set *)local_118);
                if (splitters.pivots.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_d8,
                             (value_type_conflict3 *)
                             &splitters.pivots.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
              }
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_a8);
              auVar22 = (undefined1  [8])
                        markedPartitions.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            }
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68);
        }
        (__return_storage_ptr__->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::reserve(__return_storage_ptr__,(size_type)local_288);
        for (uVar19 = 0; uVar19 < (ulong)local_288; uVar19 = uVar19 + 1) {
          auStack_68 = (undefined1  [8])0x0;
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68,
                     partitions.beginnings.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[uVar19] -
                     partitions.setIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[uVar19]);
          sVar24 = partitions.sets;
          uVar28 = partitions.beginnings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[uVar19];
          for (lVar7 = partitions.setIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[uVar19] << 3; uVar28 << 3 != lVar7;
              lVar7 = lVar7 + 8) {
            auStack_a8 = *(undefined1 (*) [8])(sVar24 + lVar7);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68,
                       (value_type_conflict3 *)auStack_a8);
          }
          std::
          vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      *)__return_storage_ptr__,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_68);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_d8);
        anon_unknown_0::Partitions::~Partitions
                  ((Partitions *)
                   &partitions.pivots.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_f8);
        std::
        vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
        ::~vector((vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                   *)&resultPartitions);
        anon_unknown_0::Partitions::~Partitions((Partitions *)local_288);
        return __return_storage_ptr__;
      }
      std::__throw_length_error("vector::reserve");
    }
    pvVar25 = (pvVar8->
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (pvVar8->
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __k != pvVar25; __k = __k + 1) {
      markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (__k->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      uVar28 = 0;
      for (__y = (_Base_ptr)
                 (__k->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
          __y != (_Base_ptr)
                 markedPartitions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage; __y = (_Base_ptr)&__y->_M_parent
          ) {
        pPVar23 = &splitters;
        iVar9 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                ::_M_lower_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                                  *)splitters.elements.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(_Link_type)&splitters
                                 ,__y,(unsigned_long *)__k);
        if (((Partitions *)iVar9._M_node == &splitters) ||
           (*(ulong *)__y < *(ulong *)(iVar9._M_node + 1))) {
          pPVar10 = (Partitions *)operator_new(0x40);
          puVar32 = *(pointer *)__y;
          (pPVar10->setIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pPVar10->elementIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = puVar32;
          (pPVar10->elementIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pPVar10->elementIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((Partitions *)iVar9._M_node == &splitters) {
            if ((splitters.elementIndices.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start == (pointer)0x0) ||
               (iVar9._M_node =
                     (_Base_ptr)
                     splitters.elements.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
               puVar32 <=
               (pointer)splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[4])) {
LAB_00c8ccf9:
              bVar33 = true;
              pvVar17 = &splitters.elements;
              iVar9._M_node = (_Base_ptr)&splitters;
              while (pPVar11 = (Partitions *)
                               (pvVar17->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start,
                    pPVar11 != (Partitions *)0x0) {
                bVar33 = puVar32 < (pPVar11->elementIndices).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (&(pPVar11->elements).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish + !bVar33);
                iVar9._M_node = (_Base_ptr)pPVar11;
              }
              iVar12._M_node = iVar9._M_node;
              if (bVar33) {
                if (iVar9._M_node ==
                    (_Base_ptr)
                    splitters.elements.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_00c8cd47;
                iVar12._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar9._M_node);
              }
              if (puVar32 <=
                  (((Partitions *)iVar12._M_node)->elementIndices).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start) {
LAB_00c8cd83:
                iVar9._M_node = iVar12._M_node;
                std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                ::_M_drop_node((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>_>_>_>
                                *)pPVar10,(_Link_type)pPVar23);
                goto LAB_00c8cd92;
              }
            }
LAB_00c8cd47:
            iVar12._M_node = (_Base_ptr)(Partitions *)0x0;
          }
          else if (puVar32 < *(pointer *)(iVar9._M_node + 1)) {
            iVar12._M_node =
                 (_Base_ptr)
                 splitters.elements.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            pPVar11 = (Partitions *)
                      splitters.elements.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((_Base_ptr)
                splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_finish == iVar9._M_node) {
LAB_00c8cd4d:
              iVar9._M_node = (_Base_ptr)pPVar11;
              if (pPVar11 == (Partitions *)0x0) goto LAB_00c8cd83;
            }
            else {
              pPVar11 = (Partitions *)std::_Rb_tree_decrement(iVar9._M_node);
              if (puVar32 <=
                  (pPVar11->elementIndices).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start) goto LAB_00c8ccf9;
              iVar12 = iVar9;
              if ((pPVar11->elements).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                iVar12._M_node = (_Base_ptr)(Partitions *)0x0;
                iVar9._M_node = (_Base_ptr)pPVar11;
              }
            }
          }
          else {
            iVar12 = iVar9;
            if (puVar32 <= *(pointer *)(iVar9._M_node + 1)) goto LAB_00c8cd83;
            if ((_Base_ptr)
                splitters.elements.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == iVar9._M_node) {
              iVar12._M_node = (_Base_ptr)0x0;
              pPVar11 = (Partitions *)
                        splitters.elements.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
              goto LAB_00c8cd4d;
            }
            pPVar11 = (Partitions *)std::_Rb_tree_increment(iVar9._M_node);
            if ((pPVar11->elementIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start <= puVar32) goto LAB_00c8ccf9;
            iVar12._M_node = (_Base_ptr)(iVar9._M_node)->_M_right;
            if ((Partitions *)(iVar9._M_node)->_M_right != (Partitions *)0x0) {
              iVar12._M_node = (_Base_ptr)pPVar11;
              iVar9._M_node = (_Base_ptr)pPVar11;
            }
          }
          bVar33 = true;
          if (((Partitions *)iVar12._M_node == (Partitions *)0x0) &&
             (&splitters != (Partitions *)iVar9._M_node)) {
            bVar33 = puVar32 < (((Partitions *)iVar9._M_node)->elementIndices).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start;
          }
          pPVar23 = pPVar10;
          std::_Rb_tree_insert_and_rebalance
                    (bVar33,(_Rb_tree_node_base *)pPVar10,iVar9._M_node,
                     (_Rb_tree_node_base *)&splitters);
          splitters.elementIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)splitters.elementIndices.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + 1);
          iVar9._M_node = (_Base_ptr)pPVar10;
        }
LAB_00c8cd92:
        puVar32 = (((Partitions *)iVar9._M_node)->elementIndices).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (puVar32 ==
            (((Partitions *)iVar9._M_node)->setIndices).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar24 = 1;
          this_00 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                     *)std::
                       vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                       ::_M_check_len((vector<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                                       *)&(((Partitions *)iVar9._M_node)->elementIndices).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,1,
                                      "vector::_M_realloc_insert");
          p_Var14 = (_Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                     *)(((Partitions *)iVar9._M_node)->elementIndices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          puVar3 = (((Partitions *)iVar9._M_node)->elementIndices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pTVar13 = std::
                    _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
                    ::_M_allocate(this_00,sVar24);
          sVar30 = (long)puVar32 - (long)p_Var14;
          *(unsigned_long *)((long)pTVar13 + sVar30) = local_48;
          *(unsigned_long *)((long)pTVar13 + sVar30 + 8) = uVar28;
          sVar24 = extraout_RDX;
          if (0 < (long)sVar30) {
            memmove(pTVar13,p_Var14,sVar30);
            sVar24 = extraout_RDX_00;
          }
          __dest_00 = (void *)((long)pTVar13 + sVar30 + 0x10);
          sVar30 = (long)puVar3 - (long)puVar32;
          if (0 < (long)sVar30) {
            memcpy(__dest_00,puVar32,sVar30);
            sVar24 = extraout_RDX_01;
          }
          pPVar23 = (Partitions *)
                    ((long)(((Partitions *)iVar9._M_node)->setIndices).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start - (long)p_Var14 >> 4);
          std::
          _Vector_base<wasm::DFA::(anonymous_namespace)::Transition,_std::allocator<wasm::DFA::(anonymous_namespace)::Transition>_>
          ::_M_deallocate(p_Var14,(pointer)pPVar23,sVar24);
          (((Partitions *)iVar9._M_node)->elementIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = &pTVar13->pred;
          (((Partitions *)iVar9._M_node)->elementIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)((long)__dest_00 + sVar30);
          (((Partitions *)iVar9._M_node)->setIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = &pTVar13[(long)this_00].pred;
        }
        else {
          *puVar32 = local_48;
          puVar32[1] = uVar28;
          (((Partitions *)iVar9._M_node)->elementIndices).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar32 + 2;
        }
        uVar28 = uVar28 + 1;
      }
      local_48 = local_48 + 1;
    }
    pvVar8 = pvVar8 + 1;
  } while( true );
}

Assistant:

std::vector<std::vector<size_t>>
refinePartitionsImpl(const InputGraph& inputGraph) {
  // Find the number of states and transitions.
  size_t numElements = 0;
  size_t numTransitions = 0;
  for (const auto& partition : inputGraph) {
    numElements += partition.size();
    for (const auto& elem : partition) {
      numTransitions += elem.size();
    }
  }

  // The partitions of DFA states.
  Partitions partitions = initializeStatePartitions(inputGraph, numElements);

  // The transitions arranged such that the transitions leading to state `q` are
  // `transitions[transitionIndices[q] : transitionIndices[q+1]]`.
  std::vector<Transition> transitions;
  std::vector<size_t> transitionIndices;
  initializeTransitions(
    inputGraph, numElements, numTransitions, transitions, transitionIndices);

  // The splitters, which are partitions of the input transitions.
  Partitions splitters =
    initializeSplitterPartitions(partitions, transitions, transitionIndices);

  // The list of splitter partitions that might be able to split states in some
  // state partition. Starts out containing all splitter partitions.
  std::vector<size_t> potentialSplitters;
  potentialSplitters.reserve(splitters.sets);
  for (size_t i = 0; i < splitters.sets; ++i) {
    potentialSplitters.push_back(i);
  }

  while (!potentialSplitters.empty()) {
    size_t potentialSplitter = potentialSplitters.back();
    potentialSplitters.pop_back();

    // The partitions that may be able to be split.
    std::vector<size_t> markedPartitions;

    // Mark states that are predecessors via this splitter partition.
    for (size_t transition : splitters.getSet(potentialSplitter)) {
      size_t state = transitions[transition].pred;
      auto partition = partitions.getSetForElem(state);
      if (!partition.hasMarks()) {
        markedPartitions.push_back(partition.index);
      }
      partitions.mark(state);
    }

    // Try to split each partition with marked states.
    for (size_t partition : markedPartitions) {
      size_t newPartition = partitions.getSet(partition).split();
      if (!newPartition) {
        // There was nothing to split.
        continue;
      }

      // We only want to keep using the smaller of the two split partitions.
      if (partitions.getSet(newPartition).size() <
          partitions.getSet(partition).size()) {
        newPartition = partition;
      }

      // The splitter partitions that may need to be split to match the new
      // split of the state partitions.
      std::vector<size_t> markedSplitters;

      // Mark transitions that lead to the newly split off states.
      for (size_t state : partitions.getSet(newPartition)) {
        for (size_t t = transitionIndices[state],
                    end = transitionIndices[state + 1];
             t < end;
             ++t) {
          auto splitter = splitters.getSetForElem(t);
          if (!splitter.hasMarks()) {
            markedSplitters.push_back(splitter.index);
          }
          splitters.mark(t);
        }
      }

      // Split the splitters and update `potentialSplitters`.
      for (size_t splitter : markedSplitters) {
        size_t newSplitter = splitters.getSet(splitter).split();
        if (newSplitter) {
          potentialSplitters.push_back(newSplitter);
        }
      }
    }
  }

  // Return the refined partitions.
  std::vector<std::vector<size_t>> resultPartitions;
  resultPartitions.reserve(partitions.sets);
  for (size_t p = 0; p < partitions.sets; ++p) {
    auto partition = partitions.getSet(p);
    std::vector<size_t> resultPartition;
    resultPartition.reserve(partition.size());
    for (size_t elem : partition) {
      resultPartition.push_back(elem);
    }
    resultPartitions.emplace_back(std::move(resultPartition));
  }
  return resultPartitions;
}